

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ImGui::ShowStyleEditor(ImGuiStyle *ref)

{
  float fVar1;
  ImVec4 IVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [11];
  undefined1 auVar8 [11];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  bool bVar15;
  int iVar16;
  ImGuiStyle *__src;
  ImGuiTextFilter *__s;
  size_t sVar17;
  ImVec4 *pIVar18;
  ImGuiIO *uv0;
  ImFont **ppIVar19;
  ImVec4 *pIVar20;
  ImGuiStyle *in_RDI;
  undefined1 extraout_XMM0_Ba;
  char cVar21;
  undefined1 extraout_XMM0_Bb;
  char cVar22;
  undefined1 extraout_XMM0_Bc;
  char cVar23;
  undefined1 extraout_XMM0_Bd;
  char cVar24;
  undefined1 extraout_XMM0_Be;
  char cVar25;
  undefined1 extraout_XMM0_Bf;
  char cVar26;
  undefined1 extraout_XMM0_Bg;
  char cVar27;
  undefined1 extraout_XMM0_Bh;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  byte bVar36;
  float rad;
  int n;
  float off_x;
  float RAD_MAX;
  float RAD_MIN;
  ImDrawList *draw_list;
  ImVec2 p;
  ImGuiColorEditFlags in_stack_0000008c;
  float MAX_SCALE;
  float MIN_SCALE;
  char *in_stack_00000098;
  ImVec4 border_col;
  ImVec4 tint_col;
  ImFont *font;
  int i_2;
  ImFontAtlas *atlas;
  ImGuiIO *io;
  char *name_1;
  int i_1;
  char *name;
  ImVec4 *col;
  int i;
  int window_menu_button_position;
  bool border_2;
  bool border_1;
  bool border;
  ImGuiStyle *style;
  undefined4 in_stack_fffffffffffffe98;
  ImGuiSliderFlags in_stack_fffffffffffffe9c;
  ImDrawList *in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  ImGuiTextFilter *in_stack_fffffffffffffeb0;
  ImGuiTextFilter *in_stack_fffffffffffffeb8;
  ImGuiTextFilter *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  float fVar37;
  undefined4 in_stack_fffffffffffffed4;
  float local_128;
  float local_120;
  ImVec2 local_11c;
  ImVec2 local_114;
  float local_10c;
  int local_108;
  float local_104;
  float local_100;
  float local_fc;
  ImDrawList *local_f8;
  ImGuiStyle *in_stack_ffffffffffffff10;
  ImVec2 IVar38;
  undefined1 local_e8 [8];
  ImVec2 in_stack_ffffffffffffff20;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec4 local_b8;
  ImFont *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  ImFontAtlas *uv1;
  ImVec2 in_stack_ffffffffffffff88;
  ImVec2 in_stack_ffffffffffffff90;
  int local_5c;
  ImVec2 local_58;
  ImGuiTextFilter *in_stack_ffffffffffffffb0;
  ImVec4 *in_stack_ffffffffffffffb8;
  int local_40;
  ImVec2 local_3c;
  int local_34;
  ImVec2 in_stack_ffffffffffffffd0;
  ImVec2 in_stack_ffffffffffffffd8;
  ImGuiStyle *local_8;
  
  __src = GetStyle();
  if ((ShowStyleEditor(ImGuiStyle*)::ref_saved_style == '\0') &&
     (iVar16 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style), iVar16 != 0)) {
    ImGuiStyle::ImGuiStyle(in_stack_ffffffffffffff10);
    __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
  }
  if (((ShowStyleEditor::init & 1U) != 0) && (in_RDI == (ImGuiStyle *)0x0)) {
    memcpy(&ShowStyleEditor::ref_saved_style,__src,0x3bc);
  }
  ShowStyleEditor::init = false;
  local_8 = in_RDI;
  if (in_RDI == (ImGuiStyle *)0x0) {
    local_8 = &ShowStyleEditor::ref_saved_style;
  }
  GetWindowWidth();
  PushItemWidth((float)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
  bVar15 = ShowStyleSelector((char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  if (bVar15) {
    memcpy(&ShowStyleEditor::ref_saved_style,__src,0x3bc);
  }
  ShowFontSelector((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  bVar15 = SliderFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                       (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                       SUB84(in_stack_fffffffffffffeb0,0),
                       (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                       (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
  if (bVar15) {
    __src->GrabRounding = __src->FrameRounding;
  }
  fVar1 = __src->WindowBorderSize;
  bVar15 = Checkbox((char *)in_stack_ffffffffffffffd8,(bool *)in_stack_ffffffffffffffd0);
  if (bVar15) {
    local_120 = 1.0;
    if (fVar1 <= 0.0) {
      local_120 = 0.0;
    }
    __src->WindowBorderSize = local_120;
  }
  SameLine((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),SUB84(in_stack_fffffffffffffea0,0));
  fVar1 = __src->FrameBorderSize;
  bVar15 = Checkbox((char *)in_stack_ffffffffffffffd8,(bool *)in_stack_ffffffffffffffd0);
  if (bVar15) {
    local_128 = 1.0;
    if (fVar1 <= 0.0) {
      local_128 = 0.0;
    }
    __src->FrameBorderSize = local_128;
  }
  SameLine((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),SUB84(in_stack_fffffffffffffea0,0));
  fVar1 = __src->PopupBorderSize;
  bVar15 = Checkbox((char *)in_stack_ffffffffffffffd8,(bool *)in_stack_ffffffffffffffd0);
  if (bVar15) {
    in_stack_fffffffffffffecc = 0;
    fVar37 = 1.0;
    if (fVar1 <= 0.0) {
      fVar37 = 0.0;
    }
    __src->PopupBorderSize = fVar37;
  }
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8,0.0,0.0);
  bVar15 = Button((char *)in_stack_fffffffffffffea0,
                  (ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  if (bVar15) {
    memcpy(&ShowStyleEditor::ref_saved_style,__src,0x3bc);
    memcpy(local_8,&ShowStyleEditor::ref_saved_style,0x3bc);
  }
  SameLine((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),SUB84(in_stack_fffffffffffffea0,0));
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,0.0,0.0);
  bVar15 = Button((char *)in_stack_fffffffffffffea0,
                  (ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  if (bVar15) {
    memcpy(__src,local_8,0x3bc);
  }
  SameLine((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),SUB84(in_stack_fffffffffffffea0,0));
  HelpMarker((char *)0x1759be);
  Separator();
  bVar15 = BeginTabBar((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                       (ImGuiTabBarFlags)((ulong)in_stack_fffffffffffffec0 >> 0x20));
  if (bVar15) {
    bVar15 = BeginTabItem((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                          (bool *)in_stack_fffffffffffffec0,
                          (ImGuiTabItemFlags)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    if (bVar15) {
      Text("Main");
      SliderFloat2(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                   (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                   SUB84(in_stack_fffffffffffffeb0,0),
                   (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SliderFloat2(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                   (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                   SUB84(in_stack_fffffffffffffeb0,0),
                   (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SliderFloat2(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                   (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                   SUB84(in_stack_fffffffffffffeb0,0),
                   (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SliderFloat2(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                   (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                   SUB84(in_stack_fffffffffffffeb0,0),
                   (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SliderFloat2(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                   (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                   SUB84(in_stack_fffffffffffffeb0,0),
                   (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SliderFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                  (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                  SUB84(in_stack_fffffffffffffeb0,0),
                  (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SliderFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                  (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                  SUB84(in_stack_fffffffffffffeb0,0),
                  (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SliderFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                  (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                  SUB84(in_stack_fffffffffffffeb0,0),
                  (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      Text("Borders");
      SliderFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                  (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                  SUB84(in_stack_fffffffffffffeb0,0),
                  (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SliderFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                  (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                  SUB84(in_stack_fffffffffffffeb0,0),
                  (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SliderFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                  (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                  SUB84(in_stack_fffffffffffffeb0,0),
                  (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SliderFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                  (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                  SUB84(in_stack_fffffffffffffeb0,0),
                  (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SliderFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                  (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                  SUB84(in_stack_fffffffffffffeb0,0),
                  (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      Text("Rounding");
      SliderFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                  (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                  SUB84(in_stack_fffffffffffffeb0,0),
                  (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SliderFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                  (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                  SUB84(in_stack_fffffffffffffeb0,0),
                  (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SliderFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                  (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                  SUB84(in_stack_fffffffffffffeb0,0),
                  (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SliderFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                  (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                  SUB84(in_stack_fffffffffffffeb0,0),
                  (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SliderFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                  (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                  SUB84(in_stack_fffffffffffffeb0,0),
                  (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SliderFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                  (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                  SUB84(in_stack_fffffffffffffeb0,0),
                  (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SliderFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                  (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                  SUB84(in_stack_fffffffffffffeb0,0),
                  (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SliderFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                  (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                  SUB84(in_stack_fffffffffffffeb0,0),
                  (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      Text("Alignment");
      SliderFloat2(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                   (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                   SUB84(in_stack_fffffffffffffeb0,0),
                   (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      local_34 = __src->WindowMenuButtonPosition + 1;
      bVar15 = Combo(in_stack_fffffffffffffec0->InputBuf,(int *)in_stack_fffffffffffffeb8,
                     in_stack_fffffffffffffeb0->InputBuf,(int)in_stack_fffffffffffffeac);
      if (bVar15) {
        __src->WindowMenuButtonPosition = local_34 + -1;
      }
      Combo(in_stack_fffffffffffffec0->InputBuf,(int *)in_stack_fffffffffffffeb8,
            in_stack_fffffffffffffeb0->InputBuf,(int)in_stack_fffffffffffffeac);
      SliderFloat2(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                   (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                   SUB84(in_stack_fffffffffffffeb0,0),
                   (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SameLine((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),SUB84(in_stack_fffffffffffffea0,0))
      ;
      HelpMarker((char *)0x175ec4);
      SliderFloat2(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                   (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                   SUB84(in_stack_fffffffffffffeb0,0),
                   (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      SameLine((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),SUB84(in_stack_fffffffffffffea0,0))
      ;
      HelpMarker((char *)0x175f0f);
      Text("Safe Area Padding");
      SameLine((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),SUB84(in_stack_fffffffffffffea0,0))
      ;
      HelpMarker((char *)0x175f39);
      SliderFloat2(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                   (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                   SUB84(in_stack_fffffffffffffeb0,0),
                   (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      EndTabItem();
    }
    bVar15 = BeginTabItem((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                          (bool *)in_stack_fffffffffffffec0,
                          (ImGuiTabItemFlags)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    if (bVar15) {
      ImVec2::ImVec2(&local_3c,0.0,0.0);
      bVar15 = Button((char *)in_stack_fffffffffffffea0,
                      (ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      cVar21 = (char)((ulong)in_stack_ffffffffffffffb0 >> 0x38);
      if (bVar15) {
        iVar16 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
        if (ShowStyleEditor::output_dest == 0) {
          LogToClipboard(iVar16);
        }
        else {
          LogToTTY(iVar16);
        }
        LogText("ImVec4* colors = ImGui::GetStyle().Colors;\n");
        for (local_40 = 0; cVar21 = (char)((ulong)in_stack_ffffffffffffffb0 >> 0x38),
            local_40 < 0x30; local_40 = local_40 + 1) {
          in_stack_ffffffffffffffb8 = __src->Colors + local_40;
          __s = (ImGuiTextFilter *)GetStyleColorName(local_40);
          in_stack_ffffffffffffffb0 = __s;
          if ((ShowStyleEditor::output_only_modified & 1U) == 0) {
LAB_00176084:
            sVar17 = strlen((char *)__s);
            LogText((char *)CONCAT17(extraout_XMM0_Bh,
                                     CONCAT16(extraout_XMM0_Bg,
                                              CONCAT15(extraout_XMM0_Bf,
                                                       CONCAT14(extraout_XMM0_Be,
                                                                CONCAT13(extraout_XMM0_Bd,
                                                                         CONCAT12(extraout_XMM0_Bc,
                                                                                  CONCAT11(
                                                  extraout_XMM0_Bb,extraout_XMM0_Ba))))))),
                    (double)in_stack_ffffffffffffffb8->y,(double)in_stack_ffffffffffffffb8->z,
                    (double)in_stack_ffffffffffffffb8->w,
                    "colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);\n",__s,
                    (ulong)(0x17 - (int)sVar17),"");
            in_stack_fffffffffffffec0 = __s;
          }
          else {
            IVar2 = local_8->Colors[local_40];
            cVar21 = -(*(char *)&in_stack_ffffffffffffffb8->x == IVar2.x._0_1_);
            cVar22 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->x + 1) == IVar2.x._1_1_);
            cVar23 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->x + 2) == IVar2.x._2_1_);
            cVar24 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->x + 3) == IVar2.x._3_1_);
            cVar25 = -(*(char *)&in_stack_ffffffffffffffb8->y == IVar2.y._0_1_);
            cVar26 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->y + 1) == IVar2.y._1_1_);
            cVar27 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->y + 2) == IVar2.y._2_1_);
            cVar28 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->y + 3) == IVar2.y._3_1_);
            cVar29 = -(*(char *)&in_stack_ffffffffffffffb8->z == IVar2.z._0_1_);
            cVar30 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->z + 1) == IVar2.z._1_1_);
            cVar31 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->z + 2) == IVar2.z._2_1_);
            cVar32 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->z + 3) == IVar2.z._3_1_);
            cVar33 = -(*(char *)&in_stack_ffffffffffffffb8->w == IVar2.w._0_1_);
            cVar34 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->w + 1) == IVar2.w._1_1_);
            cVar35 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->w + 2) == IVar2.w._2_1_);
            bVar36 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->w + 3) == IVar2.w._3_1_);
            auVar5[1] = cVar22;
            auVar5[0] = cVar21;
            auVar5[2] = cVar23;
            auVar5[3] = cVar24;
            auVar5[4] = cVar25;
            auVar5[5] = cVar26;
            auVar5[6] = cVar27;
            auVar5[7] = cVar28;
            auVar5[8] = cVar29;
            auVar5[9] = cVar30;
            auVar5[10] = cVar31;
            auVar5[0xb] = cVar32;
            auVar5[0xc] = cVar33;
            auVar5[0xd] = cVar34;
            auVar5[0xe] = cVar35;
            auVar5[0xf] = bVar36;
            auVar6[1] = cVar22;
            auVar6[0] = cVar21;
            auVar6[2] = cVar23;
            auVar6[3] = cVar24;
            auVar6[4] = cVar25;
            auVar6[5] = cVar26;
            auVar6[6] = cVar27;
            auVar6[7] = cVar28;
            auVar6[8] = cVar29;
            auVar6[9] = cVar30;
            auVar6[10] = cVar31;
            auVar6[0xb] = cVar32;
            auVar6[0xc] = cVar33;
            auVar6[0xd] = cVar34;
            auVar6[0xe] = cVar35;
            auVar6[0xf] = bVar36;
            auVar13[1] = cVar24;
            auVar13[0] = cVar23;
            auVar13[2] = cVar25;
            auVar13[3] = cVar26;
            auVar13[4] = cVar27;
            auVar13[5] = cVar28;
            auVar13[6] = cVar29;
            auVar13[7] = cVar30;
            auVar13[8] = cVar31;
            auVar13[9] = cVar32;
            auVar13[10] = cVar33;
            auVar13[0xb] = cVar34;
            auVar13[0xc] = cVar35;
            auVar13[0xd] = bVar36;
            auVar11[1] = cVar25;
            auVar11[0] = cVar24;
            auVar11[2] = cVar26;
            auVar11[3] = cVar27;
            auVar11[4] = cVar28;
            auVar11[5] = cVar29;
            auVar11[6] = cVar30;
            auVar11[7] = cVar31;
            auVar11[8] = cVar32;
            auVar11[9] = cVar33;
            auVar11[10] = cVar34;
            auVar11[0xb] = cVar35;
            auVar11[0xc] = bVar36;
            auVar9[1] = cVar26;
            auVar9[0] = cVar25;
            auVar9[2] = cVar27;
            auVar9[3] = cVar28;
            auVar9[4] = cVar29;
            auVar9[5] = cVar30;
            auVar9[6] = cVar31;
            auVar9[7] = cVar32;
            auVar9[8] = cVar33;
            auVar9[9] = cVar34;
            auVar9[10] = cVar35;
            auVar9[0xb] = bVar36;
            auVar7[1] = cVar27;
            auVar7[0] = cVar26;
            auVar7[2] = cVar28;
            auVar7[3] = cVar29;
            auVar7[4] = cVar30;
            auVar7[5] = cVar31;
            auVar7[6] = cVar32;
            auVar7[7] = cVar33;
            auVar7[8] = cVar34;
            auVar7[9] = cVar35;
            auVar7[10] = bVar36;
            if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB141(auVar13 >> 7,0) & 1) << 2 |
                         (ushort)(SUB131(auVar11 >> 7,0) & 1) << 3 |
                         (ushort)(SUB121(auVar9 >> 7,0) & 1) << 4 |
                         (ushort)(SUB111(auVar7 >> 7,0) & 1) << 5 |
                         (ushort)((byte)(CONCAT19(bVar36,CONCAT18(cVar35,CONCAT17(cVar34,CONCAT16(
                                                  cVar33,CONCAT15(cVar32,CONCAT14(cVar31,CONCAT13(
                                                  cVar30,CONCAT12(cVar29,CONCAT11(cVar28,cVar27)))))
                                                  )))) >> 7) & 1) << 6 |
                         (ushort)((byte)(CONCAT18(bVar36,CONCAT17(cVar35,CONCAT16(cVar34,CONCAT15(
                                                  cVar33,CONCAT14(cVar32,CONCAT13(cVar31,CONCAT12(
                                                  cVar30,CONCAT11(cVar29,cVar28)))))))) >> 7) & 1)
                         << 7 | (ushort)(bVar36 >> 7) << 0xf) != 0xffff) goto LAB_00176084;
          }
        }
        LogFinish();
      }
      SameLine((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),SUB84(in_stack_fffffffffffffea0,0))
      ;
      SetNextItemWidth(120.0);
      Combo(in_stack_fffffffffffffec0->InputBuf,(int *)in_stack_fffffffffffffeb8,
            in_stack_fffffffffffffeb0->InputBuf,(int)in_stack_fffffffffffffeac);
      SameLine((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),SUB84(in_stack_fffffffffffffea0,0))
      ;
      Checkbox((char *)in_stack_ffffffffffffffd8,(bool *)in_stack_ffffffffffffffd0);
      if ((ShowStyleEditor(ImGuiStyle*)::filter == '\0') &&
         (iVar16 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::filter), iVar16 != 0)) {
        ImGuiTextFilter::ImGuiTextFilter
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8->InputBuf);
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,&ShowStyleEditor::filter,&__dso_handle);
        __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::filter);
      }
      GetFontSize();
      ImGuiTextFilter::Draw
                (in_stack_fffffffffffffeb0,
                 (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (float)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      bVar15 = RadioButton((char *)in_stack_ffffffffffffffb8,(bool)cVar21);
      if (bVar15) {
        ShowStyleEditor::alpha_flags = 0;
      }
      SameLine((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),SUB84(in_stack_fffffffffffffea0,0))
      ;
      bVar15 = RadioButton((char *)in_stack_ffffffffffffffb8,(bool)cVar21);
      if (bVar15) {
        ShowStyleEditor::alpha_flags = 0x20000;
      }
      SameLine((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),SUB84(in_stack_fffffffffffffea0,0))
      ;
      bVar15 = RadioButton((char *)in_stack_ffffffffffffffb8,(bool)cVar21);
      if (bVar15) {
        ShowStyleEditor::alpha_flags = 0x40000;
      }
      SameLine((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),SUB84(in_stack_fffffffffffffea0,0))
      ;
      HelpMarker((char *)0x1762e4);
      ImVec2::ImVec2(&local_58,0.0,0.0);
      BeginChild(in_stack_fffffffffffffeb0->InputBuf,
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 SUB81((ulong)in_stack_fffffffffffffea0 >> 0x38,0),
                 (ImGuiWindowFlags)in_stack_fffffffffffffea0);
      PushItemWidth((float)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      for (local_5c = 0; local_5c < 0x30; local_5c = local_5c + 1) {
        GetStyleColorName(local_5c);
        bVar15 = ImGuiTextFilter::PassFilter
                           (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0->InputBuf,
                            (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        if (bVar15) {
          PushID((int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
          ColorEdit4(in_stack_00000098,_MAX_SCALE,in_stack_0000008c);
          pIVar18 = __src->Colors + local_5c;
          IVar2 = local_8->Colors[local_5c];
          cVar21 = -(*(char *)&pIVar18->x == IVar2.x._0_1_);
          cVar22 = -(*(undefined1 *)((long)&pIVar18->x + 1) == IVar2.x._1_1_);
          cVar23 = -(*(undefined1 *)((long)&pIVar18->x + 2) == IVar2.x._2_1_);
          cVar24 = -(*(undefined1 *)((long)&pIVar18->x + 3) == IVar2.x._3_1_);
          cVar25 = -(*(char *)&pIVar18->y == IVar2.y._0_1_);
          cVar26 = -(*(undefined1 *)((long)&pIVar18->y + 1) == IVar2.y._1_1_);
          cVar27 = -(*(undefined1 *)((long)&pIVar18->y + 2) == IVar2.y._2_1_);
          cVar28 = -(*(undefined1 *)((long)&pIVar18->y + 3) == IVar2.y._3_1_);
          cVar29 = -(*(char *)&pIVar18->z == IVar2.z._0_1_);
          cVar30 = -(*(undefined1 *)((long)&pIVar18->z + 1) == IVar2.z._1_1_);
          cVar31 = -(*(undefined1 *)((long)&pIVar18->z + 2) == IVar2.z._2_1_);
          cVar32 = -(*(undefined1 *)((long)&pIVar18->z + 3) == IVar2.z._3_1_);
          cVar33 = -(*(char *)&pIVar18->w == IVar2.w._0_1_);
          cVar34 = -(*(undefined1 *)((long)&pIVar18->w + 1) == IVar2.w._1_1_);
          cVar35 = -(*(undefined1 *)((long)&pIVar18->w + 2) == IVar2.w._2_1_);
          bVar36 = -(*(undefined1 *)((long)&pIVar18->w + 3) == IVar2.w._3_1_);
          auVar3[1] = cVar22;
          auVar3[0] = cVar21;
          auVar3[2] = cVar23;
          auVar3[3] = cVar24;
          auVar3[4] = cVar25;
          auVar3[5] = cVar26;
          auVar3[6] = cVar27;
          auVar3[7] = cVar28;
          auVar3[8] = cVar29;
          auVar3[9] = cVar30;
          auVar3[10] = cVar31;
          auVar3[0xb] = cVar32;
          auVar3[0xc] = cVar33;
          auVar3[0xd] = cVar34;
          auVar3[0xe] = cVar35;
          auVar3[0xf] = bVar36;
          auVar4[1] = cVar22;
          auVar4[0] = cVar21;
          auVar4[2] = cVar23;
          auVar4[3] = cVar24;
          auVar4[4] = cVar25;
          auVar4[5] = cVar26;
          auVar4[6] = cVar27;
          auVar4[7] = cVar28;
          auVar4[8] = cVar29;
          auVar4[9] = cVar30;
          auVar4[10] = cVar31;
          auVar4[0xb] = cVar32;
          auVar4[0xc] = cVar33;
          auVar4[0xd] = cVar34;
          auVar4[0xe] = cVar35;
          auVar4[0xf] = bVar36;
          auVar14[1] = cVar24;
          auVar14[0] = cVar23;
          auVar14[2] = cVar25;
          auVar14[3] = cVar26;
          auVar14[4] = cVar27;
          auVar14[5] = cVar28;
          auVar14[6] = cVar29;
          auVar14[7] = cVar30;
          auVar14[8] = cVar31;
          auVar14[9] = cVar32;
          auVar14[10] = cVar33;
          auVar14[0xb] = cVar34;
          auVar14[0xc] = cVar35;
          auVar14[0xd] = bVar36;
          auVar12[1] = cVar25;
          auVar12[0] = cVar24;
          auVar12[2] = cVar26;
          auVar12[3] = cVar27;
          auVar12[4] = cVar28;
          auVar12[5] = cVar29;
          auVar12[6] = cVar30;
          auVar12[7] = cVar31;
          auVar12[8] = cVar32;
          auVar12[9] = cVar33;
          auVar12[10] = cVar34;
          auVar12[0xb] = cVar35;
          auVar12[0xc] = bVar36;
          auVar10[1] = cVar26;
          auVar10[0] = cVar25;
          auVar10[2] = cVar27;
          auVar10[3] = cVar28;
          auVar10[4] = cVar29;
          auVar10[5] = cVar30;
          auVar10[6] = cVar31;
          auVar10[7] = cVar32;
          auVar10[8] = cVar33;
          auVar10[9] = cVar34;
          auVar10[10] = cVar35;
          auVar10[0xb] = bVar36;
          auVar8[1] = cVar27;
          auVar8[0] = cVar26;
          auVar8[2] = cVar28;
          auVar8[3] = cVar29;
          auVar8[4] = cVar30;
          auVar8[5] = cVar31;
          auVar8[6] = cVar32;
          auVar8[7] = cVar33;
          auVar8[8] = cVar34;
          auVar8[9] = cVar35;
          auVar8[10] = bVar36;
          if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB141(auVar14 >> 7,0) & 1) << 2 |
                       (ushort)(SUB131(auVar12 >> 7,0) & 1) << 3 |
                       (ushort)(SUB121(auVar10 >> 7,0) & 1) << 4 |
                       (ushort)(SUB111(auVar8 >> 7,0) & 1) << 5 |
                       (ushort)((byte)(CONCAT19(bVar36,CONCAT18(cVar35,CONCAT17(cVar34,CONCAT16(
                                                  cVar33,CONCAT15(cVar32,CONCAT14(cVar31,CONCAT13(
                                                  cVar30,CONCAT12(cVar29,CONCAT11(cVar28,cVar27)))))
                                                  )))) >> 7) & 1) << 6 |
                       (ushort)((byte)(CONCAT18(bVar36,CONCAT17(cVar35,CONCAT16(cVar34,CONCAT15(
                                                  cVar33,CONCAT14(cVar32,CONCAT13(cVar31,CONCAT12(
                                                  cVar30,CONCAT11(cVar29,cVar28)))))))) >> 7) & 1)
                       << 7 | (ushort)(bVar36 >> 7) << 0xf) != 0xffff) {
            SameLine((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                     SUB84(in_stack_fffffffffffffea0,0));
            ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff90,0.0,0.0);
            bVar15 = Button((char *)in_stack_fffffffffffffea0,
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
            ;
            if (bVar15) {
              pIVar20 = __src->Colors + local_5c;
              pIVar18 = local_8->Colors + local_5c;
              fVar1 = pIVar20->y;
              pIVar18->x = pIVar20->x;
              pIVar18->y = fVar1;
              fVar1 = pIVar20->w;
              pIVar18->z = pIVar20->z;
              pIVar18->w = fVar1;
            }
            SameLine((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                     SUB84(in_stack_fffffffffffffea0,0));
            ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88,0.0,0.0);
            bVar15 = Button((char *)in_stack_fffffffffffffea0,
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
            ;
            if (bVar15) {
              pIVar20 = local_8->Colors + local_5c;
              pIVar18 = __src->Colors + local_5c;
              fVar1 = pIVar20->y;
              pIVar18->x = pIVar20->x;
              pIVar18->y = fVar1;
              fVar1 = pIVar20->w;
              pIVar18->z = pIVar20->z;
              pIVar18->w = fVar1;
            }
          }
          SameLine((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                   SUB84(in_stack_fffffffffffffea0,0));
          TextUnformatted((char *)in_stack_fffffffffffffea0,
                          (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          PopID();
        }
      }
      PopItemWidth();
      EndChild();
      EndTabItem();
    }
    bVar15 = BeginTabItem((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                          (bool *)in_stack_fffffffffffffec0,
                          (ImGuiTabItemFlags)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    if (bVar15) {
      uv0 = GetIO();
      uv1 = uv0->Fonts;
      HelpMarker((char *)0x1765c2);
      PushItemWidth((float)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      for (iVar16 = 0; iVar16 < (uv1->Fonts).Size; iVar16 = iVar16 + 1) {
        ppIVar19 = ImVector<ImFont_*>::operator[](&uv1->Fonts,iVar16);
        in_stack_ffffffffffffff68 = *ppIVar19;
        PushID(in_stack_fffffffffffffeb0);
        NodeFont((ImFont *)in_stack_ffffffffffffff20);
        PopID();
      }
      bVar15 = TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",uv1->TexWidth,uv1->TexHeight)
      ;
      if (bVar15) {
        ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffff58,1.0,1.0,1.0,1.0);
        ImVec4::ImVec4(&local_b8,1.0,1.0,1.0,0.5);
        in_stack_fffffffffffffeb8 = (ImGuiTextFilter *)uv1->TexID;
        ImVec2::ImVec2(&local_c0,(float)uv1->TexWidth,(float)uv1->TexHeight);
        ImVec2::ImVec2(&local_c8,0.0,0.0);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff30,1.0,1.0);
        Image((ImTextureID)in_stack_ffffffffffffff90,(ImVec2 *)in_stack_ffffffffffffff88,
              (ImVec2 *)uv0,(ImVec2 *)uv1,(ImVec4 *)CONCAT44(iVar16,in_stack_ffffffffffffff70),
              (ImVec4 *)in_stack_ffffffffffffff68);
        TreePop();
      }
      HelpMarker((char *)0x176780);
      bVar15 = DragFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                         (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                         SUB84(in_stack_fffffffffffffeb0,0),in_stack_fffffffffffffeac,
                         (char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      if (bVar15) {
        SetWindowFontScale((float)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      }
      DragFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),SUB84(in_stack_fffffffffffffeb0,0)
                ,in_stack_fffffffffffffeac,(char *)in_stack_fffffffffffffea0,
                in_stack_fffffffffffffe9c);
      PopItemWidth();
      EndTabItem();
    }
    bVar15 = BeginTabItem((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                          (bool *)in_stack_fffffffffffffec0,
                          (ImGuiTabItemFlags)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    if (bVar15) {
      Checkbox((char *)in_stack_ffffffffffffffd8,(bool *)in_stack_ffffffffffffffd0);
      SameLine((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),SUB84(in_stack_fffffffffffffea0,0))
      ;
      HelpMarker((char *)0x176865);
      Checkbox((char *)in_stack_ffffffffffffffd8,(bool *)in_stack_ffffffffffffffd0);
      SameLine((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),SUB84(in_stack_fffffffffffffea0,0))
      ;
      HelpMarker((char *)0x17689c);
      Checkbox((char *)in_stack_ffffffffffffffd8,(bool *)in_stack_ffffffffffffffd0);
      PushItemWidth((float)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      DragFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),SUB84(in_stack_fffffffffffffeb0,0)
                ,in_stack_fffffffffffffeac,(char *)in_stack_fffffffffffffea0,
                in_stack_fffffffffffffe9c);
      if (__src->CurveTessellationTol <= 0.1 && __src->CurveTessellationTol != 0.1) {
        __src->CurveTessellationTol = 0.1;
      }
      DragFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),SUB84(in_stack_fffffffffffffeb0,0)
                ,in_stack_fffffffffffffeac,(char *)in_stack_fffffffffffffea0,
                in_stack_fffffffffffffe9c);
      bVar15 = IsItemActive();
      if (bVar15) {
        GetCursorScreenPos();
        in_stack_fffffffffffffeb0 = (ImGuiTextFilter *)local_e8;
        ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffeb0,0.0,0.0);
        SetNextWindowPos((ImVec2 *)&stack0xffffffffffffff20,0,(ImVec2 *)in_stack_fffffffffffffeb0);
        BeginTooltip();
        IVar38 = GetCursorScreenPos();
        local_f8 = GetWindowDrawList();
        local_fc = 10.0;
        local_100 = 80.0;
        local_104 = 10.0;
        for (local_108 = 0; local_108 < 7; local_108 = local_108 + 1) {
          local_10c = local_fc + ((local_100 - local_fc) * (float)local_108) / 6.0;
          in_stack_fffffffffffffea0 = local_f8;
          ImVec2::ImVec2(&local_114,IVar38.x + local_104 + local_10c,IVar38.y + local_100);
          in_stack_fffffffffffffeac = local_10c;
          GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                      SUB84(in_stack_fffffffffffffeb0,0));
          ImDrawList::AddCircle
                    ((ImDrawList *)in_stack_fffffffffffffec0,(ImVec2 *)in_stack_fffffffffffffeb8,
                     (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                     (ImU32)in_stack_fffffffffffffeb0,(int)in_stack_fffffffffffffeac,
                     in_stack_fffffffffffffea8);
          local_104 = local_10c + local_10c + 10.0 + local_104;
        }
        ImVec2::ImVec2(&local_11c,local_104,local_100 * 2.0);
        Dummy((ImVec2 *)in_stack_fffffffffffffec0);
        EndTooltip();
      }
      SameLine((float)((ulong)in_stack_fffffffffffffea0 >> 0x20),SUB84(in_stack_fffffffffffffea0,0))
      ;
      HelpMarker((char *)0x176b27);
      DragFloat(in_stack_fffffffffffffec0->InputBuf,(float *)in_stack_fffffffffffffeb8,
                (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20),SUB84(in_stack_fffffffffffffeb0,0)
                ,in_stack_fffffffffffffeac,(char *)in_stack_fffffffffffffea0,
                in_stack_fffffffffffffe9c);
      PopItemWidth();
      EndTabItem();
    }
    EndTabBar();
  }
  PopItemWidth();
  return;
}

Assistant:

void ImGui::ShowStyleEditor(ImGuiStyle* ref)
{
    // You can pass in a reference ImGuiStyle structure to compare to, revert to and save to
    // (without a reference style pointer, we will use one compared locally as a reference)
    ImGuiStyle& style = ImGui::GetStyle();
    static ImGuiStyle ref_saved_style;

    // Default to using internal storage as reference
    static bool init = true;
    if (init && ref == NULL)
        ref_saved_style = style;
    init = false;
    if (ref == NULL)
        ref = &ref_saved_style;

    ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.50f);

    if (ImGui::ShowStyleSelector("Colors##Selector"))
        ref_saved_style = style;
    ImGui::ShowFontSelector("Fonts##Selector");

    // Simplified Settings (expose floating-pointer border sizes as boolean representing 0.0f or 1.0f)
    if (ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f"))
        style.GrabRounding = style.FrameRounding; // Make GrabRounding always the same value as FrameRounding
    { bool border = (style.WindowBorderSize > 0.0f); if (ImGui::Checkbox("WindowBorder", &border)) { style.WindowBorderSize = border ? 1.0f : 0.0f; } }
    ImGui::SameLine();
    { bool border = (style.FrameBorderSize > 0.0f);  if (ImGui::Checkbox("FrameBorder",  &border)) { style.FrameBorderSize  = border ? 1.0f : 0.0f; } }
    ImGui::SameLine();
    { bool border = (style.PopupBorderSize > 0.0f);  if (ImGui::Checkbox("PopupBorder",  &border)) { style.PopupBorderSize  = border ? 1.0f : 0.0f; } }

    // Save/Revert button
    if (ImGui::Button("Save Ref"))
        *ref = ref_saved_style = style;
    ImGui::SameLine();
    if (ImGui::Button("Revert Ref"))
        style = *ref;
    ImGui::SameLine();
    HelpMarker(
        "Save/Revert in local non-persistent storage. Default Colors definition are not affected. "
        "Use \"Export\" below to save them somewhere.");

    ImGui::Separator();

    if (ImGui::BeginTabBar("##tabs", ImGuiTabBarFlags_None))
    {
        if (ImGui::BeginTabItem("Sizes"))
        {
            ImGui::Text("Main");
            ImGui::SliderFloat2("WindowPadding", (float*)&style.WindowPadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("FramePadding", (float*)&style.FramePadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemSpacing", (float*)&style.ItemSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemInnerSpacing", (float*)&style.ItemInnerSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("TouchExtraPadding", (float*)&style.TouchExtraPadding, 0.0f, 10.0f, "%.0f");
            ImGui::SliderFloat("IndentSpacing", &style.IndentSpacing, 0.0f, 30.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarSize", &style.ScrollbarSize, 1.0f, 20.0f, "%.0f");
            ImGui::SliderFloat("GrabMinSize", &style.GrabMinSize, 1.0f, 20.0f, "%.0f");
            ImGui::Text("Borders");
            ImGui::SliderFloat("WindowBorderSize", &style.WindowBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("ChildBorderSize", &style.ChildBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("PopupBorderSize", &style.PopupBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("FrameBorderSize", &style.FrameBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("TabBorderSize", &style.TabBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::Text("Rounding");
            ImGui::SliderFloat("WindowRounding", &style.WindowRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ChildRounding", &style.ChildRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("PopupRounding", &style.PopupRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarRounding", &style.ScrollbarRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("GrabRounding", &style.GrabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("LogSliderDeadzone", &style.LogSliderDeadzone, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("TabRounding", &style.TabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::Text("Alignment");
            ImGui::SliderFloat2("WindowTitleAlign", (float*)&style.WindowTitleAlign, 0.0f, 1.0f, "%.2f");
            int window_menu_button_position = style.WindowMenuButtonPosition + 1;
            if (ImGui::Combo("WindowMenuButtonPosition", (int*)&window_menu_button_position, "None\0Left\0Right\0"))
                style.WindowMenuButtonPosition = window_menu_button_position - 1;
            ImGui::Combo("ColorButtonPosition", (int*)&style.ColorButtonPosition, "Left\0Right\0");
            ImGui::SliderFloat2("ButtonTextAlign", (float*)&style.ButtonTextAlign, 0.0f, 1.0f, "%.2f");
            ImGui::SameLine(); HelpMarker("Alignment applies when a button is larger than its text content.");
            ImGui::SliderFloat2("SelectableTextAlign", (float*)&style.SelectableTextAlign, 0.0f, 1.0f, "%.2f");
            ImGui::SameLine(); HelpMarker("Alignment applies when a selectable is larger than its text content.");
            ImGui::Text("Safe Area Padding");
            ImGui::SameLine(); HelpMarker("Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured).");
            ImGui::SliderFloat2("DisplaySafeAreaPadding", (float*)&style.DisplaySafeAreaPadding, 0.0f, 30.0f, "%.0f");
            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Colors"))
        {
            static int output_dest = 0;
            static bool output_only_modified = true;
            if (ImGui::Button("Export"))
            {
                if (output_dest == 0)
                    ImGui::LogToClipboard();
                else
                    ImGui::LogToTTY();
                ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;" IM_NEWLINE);
                for (int i = 0; i < ImGuiCol_COUNT; i++)
                {
                    const ImVec4& col = style.Colors[i];
                    const char* name = ImGui::GetStyleColorName(i);
                    if (!output_only_modified || memcmp(&col, &ref->Colors[i], sizeof(ImVec4)) != 0)
                        ImGui::LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);" IM_NEWLINE,
                            name, 23 - (int)strlen(name), "", col.x, col.y, col.z, col.w);
                }
                ImGui::LogFinish();
            }
            ImGui::SameLine(); ImGui::SetNextItemWidth(120); ImGui::Combo("##output_type", &output_dest, "To Clipboard\0To TTY\0");
            ImGui::SameLine(); ImGui::Checkbox("Only Modified Colors", &output_only_modified);

            static ImGuiTextFilter filter;
            filter.Draw("Filter colors", ImGui::GetFontSize() * 16);

            static ImGuiColorEditFlags alpha_flags = 0;
            if (ImGui::RadioButton("Opaque", alpha_flags == ImGuiColorEditFlags_None))             { alpha_flags = ImGuiColorEditFlags_None; } ImGui::SameLine();
            if (ImGui::RadioButton("Alpha",  alpha_flags == ImGuiColorEditFlags_AlphaPreview))     { alpha_flags = ImGuiColorEditFlags_AlphaPreview; } ImGui::SameLine();
            if (ImGui::RadioButton("Both",   alpha_flags == ImGuiColorEditFlags_AlphaPreviewHalf)) { alpha_flags = ImGuiColorEditFlags_AlphaPreviewHalf; } ImGui::SameLine();
            HelpMarker(
                "In the color list:\n"
                "Left-click on color square to open color picker,\n"
                "Right-click to open edit options menu.");

            ImGui::BeginChild("##colors", ImVec2(0, 0), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_NavFlattened);
            ImGui::PushItemWidth(-160);
            for (int i = 0; i < ImGuiCol_COUNT; i++)
            {
                const char* name = ImGui::GetStyleColorName(i);
                if (!filter.PassFilter(name))
                    continue;
                ImGui::PushID(i);
                ImGui::ColorEdit4("##color", (float*)&style.Colors[i], ImGuiColorEditFlags_AlphaBar | alpha_flags);
                if (memcmp(&style.Colors[i], &ref->Colors[i], sizeof(ImVec4)) != 0)
                {
                    // Tips: in a real user application, you may want to merge and use an icon font into the main font,
                    // so instead of "Save"/"Revert" you'd use icons!
                    // Read the FAQ and docs/FONTS.md about using icon fonts. It's really easy and super convenient!
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Save")) { ref->Colors[i] = style.Colors[i]; }
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Revert")) { style.Colors[i] = ref->Colors[i]; }
                }
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x);
                ImGui::TextUnformatted(name);
                ImGui::PopID();
            }
            ImGui::PopItemWidth();
            ImGui::EndChild();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Fonts"))
        {
            ImGuiIO& io = ImGui::GetIO();
            ImFontAtlas* atlas = io.Fonts;
            HelpMarker("Read FAQ and docs/FONTS.md for details on font loading.");
            ImGui::PushItemWidth(120);
            for (int i = 0; i < atlas->Fonts.Size; i++)
            {
                ImFont* font = atlas->Fonts[i];
                ImGui::PushID(font);
                NodeFont(font);
                ImGui::PopID();
            }
            if (ImGui::TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
            {
                ImVec4 tint_col = ImVec4(1.0f, 1.0f, 1.0f, 1.0f);
                ImVec4 border_col = ImVec4(1.0f, 1.0f, 1.0f, 0.5f);
                ImGui::Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0, 0), ImVec2(1, 1), tint_col, border_col);
                ImGui::TreePop();
            }

            // Post-baking font scaling. Note that this is NOT the nice way of scaling fonts, read below.
            // (we enforce hard clamping manually as by default DragFloat/SliderFloat allows CTRL+Click text to get out of bounds).
            const float MIN_SCALE = 0.3f;
            const float MAX_SCALE = 2.0f;
            HelpMarker(
                "Those are old settings provided for convenience.\n"
                "However, the _correct_ way of scaling your UI is currently to reload your font at the designed size, "
                "rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure.\n"
                "Using those settings here will give you poor quality results.");
            static float window_scale = 1.0f;
            if (ImGui::DragFloat("window scale", &window_scale, 0.005f, MIN_SCALE, MAX_SCALE, "%.2f", ImGuiSliderFlags_AlwaysClamp)) // Scale only this window
                ImGui::SetWindowFontScale(window_scale);
            ImGui::DragFloat("global scale", &io.FontGlobalScale, 0.005f, MIN_SCALE, MAX_SCALE, "%.2f", ImGuiSliderFlags_AlwaysClamp); // Scale everything
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Rendering"))
        {
            ImGui::Checkbox("Anti-aliased lines", &style.AntiAliasedLines);
            ImGui::SameLine();
            HelpMarker("When disabling anti-aliasing lines, you'll probably want to disable borders in your style as well.");

            ImGui::Checkbox("Anti-aliased lines use texture", &style.AntiAliasedLinesUseTex);
            ImGui::SameLine();
            HelpMarker("Faster lines using texture data. Require backend to render with bilinear filtering (not point/nearest filtering).");

            ImGui::Checkbox("Anti-aliased fill", &style.AntiAliasedFill);
            ImGui::PushItemWidth(100);
            ImGui::DragFloat("Curve Tessellation Tolerance", &style.CurveTessellationTol, 0.02f, 0.10f, 10.0f, "%.2f");
            if (style.CurveTessellationTol < 0.10f) style.CurveTessellationTol = 0.10f;

            // When editing the "Circle Segment Max Error" value, draw a preview of its effect on auto-tessellated circles.
            ImGui::DragFloat("Circle Segment Max Error", &style.CircleSegmentMaxError, 0.01f, 0.10f, 10.0f, "%.2f");
            if (ImGui::IsItemActive())
            {
                ImGui::SetNextWindowPos(ImGui::GetCursorScreenPos());
                ImGui::BeginTooltip();
                ImVec2 p = ImGui::GetCursorScreenPos();
                ImDrawList* draw_list = ImGui::GetWindowDrawList();
                float RAD_MIN = 10.0f, RAD_MAX = 80.0f;
                float off_x = 10.0f;
                for (int n = 0; n < 7; n++)
                {
                    const float rad = RAD_MIN + (RAD_MAX - RAD_MIN) * (float)n / (7.0f - 1.0f);
                    draw_list->AddCircle(ImVec2(p.x + off_x + rad, p.y + RAD_MAX), rad, ImGui::GetColorU32(ImGuiCol_Text), 0);
                    off_x += 10.0f + rad * 2.0f;
                }
                ImGui::Dummy(ImVec2(off_x, RAD_MAX * 2.0f));
                ImGui::EndTooltip();
            }
            ImGui::SameLine();
            HelpMarker("When drawing circle primitives with \"num_segments == 0\" tesselation will be calculated automatically.");

            ImGui::DragFloat("Global Alpha", &style.Alpha, 0.005f, 0.20f, 1.0f, "%.2f"); // Not exposing zero here so user doesn't "lose" the UI (zero alpha clips all widgets). But application code could have a toggle to switch between zero and non-zero.
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::PopItemWidth();
}